

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fraction.cpp
# Opt level: O2

Fraction * __thiscall
Fraction::operator+(Fraction *__return_storage_ptr__,Fraction *this,Fraction *b)

{
  Fraction a;
  BigInteger local_c0;
  BigInteger local_a0;
  BigInteger local_80;
  Fraction local_60;
  
  Fraction(&local_60,this);
  Fraction(__return_storage_ptr__);
  BigIntegerLibrary::BigInteger::operator*(&local_c0,&local_60.denominator,&b->denominator);
  BigIntegerLibrary::BigInteger::operator=(&__return_storage_ptr__->denominator,&local_c0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_c0);
  BigIntegerLibrary::BigInteger::operator*(&local_80,&local_60.numerator,&b->denominator);
  BigIntegerLibrary::BigInteger::operator*(&local_a0,&b->numerator,&local_60.denominator);
  BigIntegerLibrary::BigInteger::operator+(&local_c0,&local_80,&local_a0);
  BigIntegerLibrary::BigInteger::operator=(&__return_storage_ptr__->numerator,&local_c0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_c0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_80);
  reduction(__return_storage_ptr__);
  ~Fraction(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Fraction Fraction::operator+(const Fraction& b) const { // a/b + c/d = (ad+cb)/bd
    Fraction a = *this;
    Fraction c;
    c.denominator = a.denominator * b.denominator;
    c.numerator = a.numerator * b.denominator + b.numerator * a.denominator;
    reduction(c);
    return c;
}